

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O2

void __thiscall Population::update(Population *this)

{
  EventType eventType;
  Neuron *pNVar1;
  int iVar2;
  undefined4 extraout_var;
  int i;
  long lVar3;
  double dVar4;
  double local_20;
  
  local_20 = this->current_time;
  while( true ) {
    dVar4 = Clock::getCurrentTime(this->clock);
    if (dVar4 <= local_20) break;
    resetOutput(this);
    for (lVar3 = 0; lVar3 < this->numberOfOutputNeurons; lVar3 = lVar3 + 1) {
      pNVar1 = (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3];
      Clock::getDt(this->clock);
      iVar2 = (**pNVar1->_vptr_Neuron)(pNVar1);
      (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3] = (Event *)CONCAT44(extraout_var,iVar2);
      eventType = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3]->type;
      if (eventType != No) {
        Logging::logEvent(this->logger,(long)this,(int)lVar3,eventType);
      }
      (*(this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3]->_vptr_Neuron[2])();
    }
    local_20 = Clock::getDt(this->clock);
    local_20 = local_20 + this->current_time;
    this->current_time = local_20;
  }
  return;
}

Assistant:

virtual void update() {
        while(current_time < clock->getCurrentTime()) {
            resetOutput();
            for(int i = 0; i < numberOfOutputNeurons; i++) {
                output[i] = neurons[i]->update(clock->getDt());
                if(output[i]->type != EventType::No) {
                    logger->logEvent((long)this, i, output[i]->type);
                }
                neurons[i]->resetInput();
            }
            current_time += clock->getDt();
        }
    }